

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

float ** Emb_ManMatrAlloc(int nDims)

{
  float **ppfVar1;
  float **pMatr;
  int i;
  int nDims_local;
  
  ppfVar1 = (float **)malloc((long)nDims * 8 + (long)nDims * 4 * (long)nDims);
  *ppfVar1 = (float *)(ppfVar1 + nDims);
  for (pMatr._0_4_ = 1; (int)pMatr < nDims; pMatr._0_4_ = (int)pMatr + 1) {
    ppfVar1[(int)pMatr] = ppfVar1[(int)pMatr + -1] + nDims;
  }
  return ppfVar1;
}

Assistant:

float ** Emb_ManMatrAlloc( int nDims )
{
    int i;
    float ** pMatr = (float **)ABC_ALLOC( char, sizeof(float *) * nDims + sizeof(float) * nDims * nDims );
    pMatr[0] = (float *)(pMatr + nDims);
    for ( i = 1; i < nDims; i++ )
        pMatr[i] = pMatr[i-1] + nDims;
    return pMatr;
}